

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int Curl_hash_delete(curl_hash *h,void *key,size_t key_len)

{
  curl_llist *pcVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  curl_llist *l;
  curl_hash_element *he;
  curl_llist_element *le;
  size_t key_len_local;
  void *key_local;
  curl_hash *h_local;
  
  pcVar1 = h->table;
  sVar3 = (*h->hash_func)(key,key_len,(long)h->slots);
  he = (curl_hash_element *)pcVar1[sVar3].head;
  while( true ) {
    if (he == (curl_hash_element *)0x0) {
      return 1;
    }
    pvVar2 = (he->list).ptr;
    sVar4 = (*h->comp_func)((void *)((long)pvVar2 + 0x28),*(size_t *)((long)pvVar2 + 0x20),key,
                            key_len);
    if (sVar4 != 0) break;
    he = (curl_hash_element *)(he->list).next;
  }
  Curl_llist_remove(pcVar1 + sVar3,&he->list,h);
  h->size = h->size - 1;
  return 0;
}

Assistant:

int Curl_hash_delete(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_hash_element  *he;
  struct curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *) h);
      --h->size;
      return 0;
    }
  }
  return 1;
}